

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O2

Solution * ConstructionHeuristics::RequestsFirst(Solution *solution)

{
  pointer pvVar1;
  Turn *this;
  pointer pSVar2;
  pointer ppTVar3;
  __type _Var4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar11;
  Scenario *pSVar12;
  WeekData *pWVar13;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *__x;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar14;
  pointer ppTVar15;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  string *psVar16;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  ShiftType *pSVar17;
  mapped_type *this_02;
  const_reference ppDVar18;
  Nurse *this_03;
  string *psVar19;
  __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
  __first;
  int iVar20;
  _Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
  _Var21;
  pointer __x_00;
  pointer pSVar22;
  ulong local_138;
  const_iterator iter;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> shiftOffRequests;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  type random;
  string local_b0;
  ShiftOffRequest shiftOffRequest;
  
  uVar10 = std::chrono::_V2::system_clock::now();
  iVar7 = (int)((uVar10 & 0xffffffff) % 0x7fffffff);
  _Var21.
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x._0_4_ = iVar7 + (uint)(iVar7 == 0);
  _Var21.
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x._4_4_ = 0;
  pmVar11 = Solution::getNurses_abi_cxx11_(solution);
  random._M_f._M_param =
       (param_type)
       (((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count << 0x20) + -0x100000000);
  random._M_bound_args.
  super__Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
  .
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x =
       (_Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
        )(_Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
          )_Var21.
           super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
           ._M_head_impl._M_x;
  pSVar12 = Scenario::getInstance();
  pWVar13 = Scenario::getWeekData(pSVar12);
  __x = WeekData::getShiftOffRequests(pWVar13);
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::vector(&shiftOffRequests,__x);
  pvVar14 = Solution::getTurns(solution);
  __x_00 = (pvVar14->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (pvVar14->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__x_00 == pvVar1) {
LAB_00115e28:
      std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::~vector(&shiftOffRequests);
      return solution;
    }
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&day,__x_00);
    ppTVar3 = day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar15 = day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppTVar15 != ppTVar3; ppTVar15 = ppTVar15 + 1)
    {
      this = *ppTVar15;
      pSVar12 = Scenario::getInstance();
      pWVar13 = Scenario::getWeekData(pSVar12);
      this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)WeekData::getRequirements_abi_cxx11_(pWVar13);
      psVar16 = Turn::getSkill_abi_cxx11_(this);
      this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at(this_00,psVar16);
      pSVar17 = Turn::getShiftType(this);
      psVar16 = ShiftType::getId_abi_cxx11_(pSVar17);
      this_02 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at(this_01,psVar16);
      uVar6 = Turn::getDay(this);
      ppDVar18 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                           (this_02,(ulong)uVar6);
      iVar7 = DayRequirement::getMinimumCoverage(*ppDVar18);
      local_138 = 0;
      for (iVar20 = 0; iVar20 < iVar7; iVar20 = iVar20 + iVar8 + 1) {
        pmVar11 = Solution::getNurses_abi_cxx11_(solution);
        iter._M_node = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar8 = std::
                _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
                ::operator()(&random);
        std::
        advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,NurseSolution*>>,int>
                  (&iter,iVar8);
        pSVar2 = shiftOffRequests.
                 super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pSVar22 = shiftOffRequests.
                       super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>._M_impl
                       .super__Vector_impl_data._M_start; pSVar22 != pSVar2; pSVar22 = pSVar22 + 1)
        {
          ShiftOffRequest::ShiftOffRequest(&shiftOffRequest,pSVar22);
          psVar16 = ShiftOffRequest::getNurse_abi_cxx11_(&shiftOffRequest);
          this_03 = NurseSolution::getNurse(*(NurseSolution **)(iter._M_node + 2));
          psVar19 = Nurse::getId_abi_cxx11_(this_03);
          _Var4 = std::operator==(psVar16,psVar19);
          if (!_Var4) {
            pSVar12 = Scenario::getInstance();
            psVar16 = ShiftOffRequest::getDay_abi_cxx11_(&shiftOffRequest);
            std::__cxx11::string::string((string *)&local_b0,(string *)psVar16);
            iVar8 = Scenario::getDayOfWeek(pSVar12,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            iVar9 = Turn::getDay(this);
            if (iVar9 == iVar8) {
              psVar16 = ShiftOffRequest::getShiftType_abi_cxx11_(&shiftOffRequest);
              bVar5 = std::operator==(psVar16,"Any");
              if (!bVar5) {
                psVar16 = ShiftOffRequest::getShiftType_abi_cxx11_(&shiftOffRequest);
                pSVar17 = Turn::getShiftType(this);
                psVar19 = ShiftType::getId_abi_cxx11_(pSVar17);
                _Var4 = std::operator==(psVar16,psVar19);
                if (!_Var4) goto LAB_00115d52;
              }
              __first = std::
                        __remove_if<__gnu_cxx::__normal_iterator<ShiftOffRequest*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>,__gnu_cxx::__ops::_Iter_equals_val<ShiftOffRequest_const>>
                                  ((__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                    )shiftOffRequests.
                                     super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                   (__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                    )shiftOffRequests.
                                     super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&shiftOffRequest);
              std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::erase
                        (&shiftOffRequests,(const_iterator)__first._M_current,
                         (const_iterator)
                         shiftOffRequests.
                         super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              ShiftOffRequest::~ShiftOffRequest(&shiftOffRequest);
              iVar8 = -1;
              goto LAB_00115dce;
            }
          }
LAB_00115d52:
          ShiftOffRequest::~ShiftOffRequest(&shiftOffRequest);
        }
        bVar5 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(iter._M_node + 2),this);
        pmVar11 = Solution::getNurses_abi_cxx11_(solution);
        if ((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 2 <= local_138) {
          std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
                    (&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
          solution = (Solution *)0x0;
          goto LAB_00115e28;
        }
        iVar8 = bVar5 - 1;
LAB_00115dce:
        local_138 = local_138 + 1;
      }
    }
    std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
              (&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
    __x_00 = __x_00 + 1;
  } while( true );
}

Assistant:

Solution* ConstructionHeuristics::RequestsFirst(Solution* solution){
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    vector<ShiftOffRequest> shiftOffRequests = Scenario::getInstance()->getWeekData().getShiftOffRequests();


    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            outerLoop: for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                //check if nurse requested day off
                bool cont = false;

                for(ShiftOffRequest shiftOffRequest: shiftOffRequests) {
                    if(shiftOffRequest.getNurse() == iter->second->getNurse()->getId())
                        continue;
                    int dayInt = Scenario::getInstance()->getDayOfWeek(shiftOffRequest.getDay());
                    if(turn->getDay() == dayInt && (shiftOffRequest.getShiftType() == "Any" || shiftOffRequest.getShiftType() == turn->getShiftType()->getId())) {
                        cont = true;
                        shiftOffRequests.erase(std::remove(shiftOffRequests.begin(), shiftOffRequests.end(), shiftOffRequest), shiftOffRequests.end());
                        break;
                    }
                }
                if(cont){
                    i--;
                    continue;
                }
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}